

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<IOVariable,_8UL>::SmallVector(SmallVector<IOVariable,_8UL> *this)

{
  IOVariable *pIVar1;
  SmallVector<IOVariable,_8UL> *this_local;
  
  VectorView<IOVariable>::VectorView(&this->super_VectorView<IOVariable>);
  this->buffer_capacity = 0;
  pIVar1 = AlignedBuffer<IOVariable,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<IOVariable>).ptr = pIVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}